

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

int mbedtls_rsa_check_privkey(mbedtls_rsa_context *ctx)

{
  int iVar1;
  mbedtls_rsa_context *ctx_local;
  
  iVar1 = mbedtls_rsa_check_pubkey(ctx);
  if ((iVar1 != 0) || (iVar1 = rsa_check_context(ctx,1,1), iVar1 != 0)) {
    return -0x4200;
  }
  iVar1 = mbedtls_rsa_validate_params
                    (&ctx->N,&ctx->P,&ctx->Q,&ctx->D,&ctx->E,
                     (_func_int_void_ptr_uchar_ptr_size_t *)0x0,(void *)0x0);
  if (iVar1 != 0) {
    return -0x4200;
  }
  iVar1 = mbedtls_rsa_validate_crt(&ctx->P,&ctx->Q,&ctx->D,&ctx->DP,&ctx->DQ,&ctx->QP);
  if (iVar1 != 0) {
    return -0x4200;
  }
  return 0;
}

Assistant:

int mbedtls_rsa_check_privkey( const mbedtls_rsa_context *ctx )
{
    RSA_VALIDATE_RET( ctx != NULL );

    if( mbedtls_rsa_check_pubkey( ctx ) != 0 ||
        rsa_check_context( ctx, 1 /* private */, 1 /* blinding */ ) != 0 )
    {
        return( MBEDTLS_ERR_RSA_KEY_CHECK_FAILED );
    }

    if( mbedtls_rsa_validate_params( &ctx->N, &ctx->P, &ctx->Q,
                                     &ctx->D, &ctx->E, NULL, NULL ) != 0 )
    {
        return( MBEDTLS_ERR_RSA_KEY_CHECK_FAILED );
    }

#if !defined(MBEDTLS_RSA_NO_CRT)
    else if( mbedtls_rsa_validate_crt( &ctx->P, &ctx->Q, &ctx->D,
                                       &ctx->DP, &ctx->DQ, &ctx->QP ) != 0 )
    {
        return( MBEDTLS_ERR_RSA_KEY_CHECK_FAILED );
    }
#endif

    return( 0 );
}